

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertEqualStringArray
               (char **expected,char **actual,_UU32 num_elements,char *msg,_U_UINT lineNumber)

{
  int iVar1;
  bool bVar2;
  uint local_38;
  uint local_34;
  _UU32 j;
  _UU32 i;
  _U_UINT lineNumber_local;
  char *msg_local;
  _UU32 num_elements_local;
  char **actual_local;
  char **expected_local;
  
  local_38 = 0;
  if ((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) {
    if (num_elements == 0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    iVar1 = UnityCheckArraysForNull(expected,actual,lineNumber,msg);
    if (iVar1 != 1) {
      do {
        if ((expected[local_38] == (char *)0x0) || (actual[local_38] == (char *)0x0)) {
          if (expected[local_38] != actual[local_38]) {
            Unity.CurrentTestFailed = 1;
          }
        }
        else {
          local_34 = 0;
          while( true ) {
            bVar2 = true;
            if (expected[local_38][local_34] == '\0') {
              bVar2 = actual[local_38][local_34] != '\0';
            }
            if (!bVar2) goto LAB_00102e0b;
            if (expected[local_38][local_34] != actual[local_38][local_34]) break;
            local_34 = local_34 + 1;
          }
          Unity.CurrentTestFailed = 1;
        }
LAB_00102e0b:
        if (Unity.CurrentTestFailed != 0) {
          UnityTestResultsFailBegin(lineNumber);
          if (1 < num_elements) {
            UnityPrint(" Element ");
            UnityPrintNumberUnsigned((ulong)local_38);
          }
          UnityPrintExpectedAndActualStrings(expected[local_38],actual[local_38]);
          UnityAddMsgIfSpecified(msg);
          Unity.CurrentTestFailed = 1;
          longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
        }
        local_38 = local_38 + 1;
      } while (local_38 < num_elements);
    }
  }
  return;
}

Assistant:

void UnityAssertEqualStringArray( const char** expected,
                                  const char** actual,
                                  const _UU32 num_elements,
                                  const char* msg,
                                  const UNITY_LINE_TYPE lineNumber)
{
    _UU32 i, j = 0;

    UNITY_SKIP_EXECUTION;

    /* if no elements, it's an error */
    if (num_elements == 0)
    {
        UnityPrintPointlessAndBail();
    }

    if (UnityCheckArraysForNull((UNITY_INTERNAL_PTR)expected, (UNITY_INTERNAL_PTR)actual, lineNumber, msg) == 1)
        return;

    do
    {
        /* if both pointers not null compare the strings */
        if (expected[j] && actual[j])
        {
            for (i = 0; expected[j][i] || actual[j][i]; i++)
            {
                if (expected[j][i] != actual[j][i])
                {
                    Unity.CurrentTestFailed = 1;
                    break;
                }
            }
        }
        else
        { /* handle case of one pointers being null (if both null, test should pass) */
            if (expected[j] != actual[j])
            {
                Unity.CurrentTestFailed = 1;
            }
        }

        if (Unity.CurrentTestFailed)
        {
            UnityTestResultsFailBegin(lineNumber);
            if (num_elements > 1)
            {
                UnityPrint(UnityStrElement);
                UnityPrintNumberUnsigned(j);
            }
            UnityPrintExpectedAndActualStrings((const char*)(expected[j]), (const char*)(actual[j]));
            UnityAddMsgIfSpecified(msg);
            UNITY_FAIL_AND_BAIL;
        }
    } while (++j < num_elements);
}